

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O0

p2sc_iofile_t * p2sc_open_iofile(char *name,char *mode)

{
  int iVar1;
  p2sc_iofile_t *ppVar2;
  char *pcVar3;
  GIOChannel *pGVar4;
  char *in_RSI;
  char *in_RDI;
  GIOStatus status;
  p2sc_iofile_t *f;
  GError *err;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 uVar5;
  long local_20;
  char *local_18;
  char *local_10;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  local_20 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  ppVar2 = (p2sc_iofile_t *)g_malloc(0x18);
  if (*local_10 == '-') {
    if (*local_18 == 'r') {
      pcVar3 = (char *)g_strdup("stdin");
      ppVar2->name = pcVar3;
      pGVar4 = (GIOChannel *)g_io_channel_unix_new(0);
      ppVar2->io = pGVar4;
    }
    else {
      if ((*local_18 != 'w') && (*local_18 != 'a')) {
        _p2sc_msg("p2sc_open_iofile",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
                  ,0x6f,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",4000,
                  "Unknown mode %s on %s",local_18,local_10);
        exit(1);
      }
      pcVar3 = (char *)g_strdup("stdout");
      ppVar2->name = pcVar3;
      pGVar4 = (GIOChannel *)g_io_channel_unix_new(1);
      ppVar2->io = pGVar4;
    }
  }
  else {
    pcVar3 = (char *)g_strdup(local_10);
    ppVar2->name = pcVar3;
    pGVar4 = (GIOChannel *)g_io_channel_new_file(ppVar2->name,local_18,&local_20);
    ppVar2->io = pGVar4;
  }
  if (ppVar2->io == (GIOChannel *)0x0) {
    if ((local_20 != 0) && (*(long *)(local_20 + 8) != 0)) {
      _p2sc_msg("p2sc_open_iofile",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
                ,0x89,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,
                "%s: failed to open IO channel: %s",ppVar2->name,*(undefined8 *)(local_20 + 8));
      exit(1);
    }
    _p2sc_msg("p2sc_open_iofile",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
              ,0x8d,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,
              "%s: failed to open IO channel: unknown reason",ppVar2->name);
    exit(1);
  }
  iVar1 = g_io_channel_set_encoding(ppVar2->io,0,&local_20);
  if ((local_20 != 0) && (*(long *)(local_20 + 8) != 0)) {
    _p2sc_msg("p2sc_open_iofile",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
              ,0x79,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,
              "%s: failed to change encoding of IO channel: %s",ppVar2->name,
              *(undefined8 *)(local_20 + 8));
    exit(1);
  }
  if (iVar1 == 1) {
    g_io_channel_set_close_on_unref(ppVar2->io,1);
    ppVar2->lineno = 0;
    return ppVar2;
  }
  _p2sc_msg("p2sc_open_iofile",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
            ,0x81,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,
            "%s: failed to change encoding of IO channel with status %d",ppVar2->name,
            CONCAT44(uVar5,iVar1));
  exit(1);
}

Assistant:

p2sc_iofile_t *p2sc_open_iofile(const char *name, const char *mode) {
    GError *err = NULL;
    p2sc_iofile_t *f = (p2sc_iofile_t *) g_malloc(sizeof *f);

    if (name[0] == '-') {
        if (mode[0] == 'r') {
            f->name = g_strdup("stdin");
            f->io = g_io_channel_unix_new(STDIN_FILENO);
        } else if (mode[0] == 'w' || mode[0] == 'a') {
            f->name = g_strdup("stdout");
            f->io = g_io_channel_unix_new(STDOUT_FILENO);
        } else
            P2SC_Msg(LVL_FATAL, "Unknown mode %s on %s", mode, name);
    } else {
        f->name = g_strdup(name);
        f->io = g_io_channel_new_file(f->name, mode, &err);
    }

    if (f->io) {
        GIOStatus status = g_io_channel_set_encoding(f->io, NULL, &err);
        if (err && err->message) {
            P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s: failed to change encoding of IO channel: %s",
                     f->name, err->message);
            g_error_free(err);
            /* not reached */
            p2sc_free_iofile(f);
            return NULL;
        } else if (status != G_IO_STATUS_NORMAL) {
            P2SC_Msg(LVL_FATAL_FILESYSTEM,
                     "%s: failed to change encoding of IO channel with status %d", f->name,
                     (int) status);
            /* not reached */
            p2sc_free_iofile(f);
            return NULL;
        }
    } else {
        if (err && err->message) {
            P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s: failed to open IO channel: %s",
                     f->name, err->message);
            g_error_free(err);
        } else
            P2SC_Msg(LVL_FATAL_FILESYSTEM,
                     "%s: failed to open IO channel: unknown reason", f->name);
        /* not reached */
        p2sc_free_iofile(f);
        return NULL;
    }

    g_io_channel_set_close_on_unref(f->io, TRUE);
    f->lineno = 0;

    return f;
}